

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls1_verify_channel_id(SSL_HANDSHAKE *hs,SSLMessage *msg)

{
  SSL *ssl_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  EC_GROUP *group;
  ECDSA_SIG *pEVar5;
  BIGNUM *pBVar6;
  uint8_t *s;
  pointer peVar7;
  pointer peVar8;
  pointer peVar9;
  BIGNUM *y_00;
  bool local_f1;
  int iStack_f0;
  bool sig_ok;
  size_t digest_len;
  uint8_t digest [64];
  unique_ptr<ec_point_st,_bssl::internal::Deleter> local_a0;
  UniquePtr<EC_POINT> point;
  UniquePtr<EC_KEY> key;
  uint8_t *p;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_80;
  UniquePtr<BIGNUM> y;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_68;
  UniquePtr<BIGNUM> x;
  UniquePtr<ECDSA_SIG> sig;
  EC_GROUP *p256;
  CBS extension;
  CBS channel_id;
  uint16_t extension_type;
  SSL *ssl;
  SSLMessage *msg_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  extension.len = (size_t)(msg->body).data;
  channel_id.data = (uint8_t *)(msg->body).len;
  iVar2 = CBS_get_u16((CBS *)&extension.len,(uint16_t *)((long)&channel_id.len + 6));
  if ((((iVar2 == 0) ||
       (iVar2 = CBS_get_u16_length_prefixed((CBS *)&extension.len,(CBS *)&p256), iVar2 == 0)) ||
      (sVar4 = CBS_len((CBS *)&extension.len), sVar4 != 0)) ||
     ((channel_id.len._6_2_ != 0x7550 || (sVar4 = CBS_len((CBS *)&p256), sVar4 != 0x80)))) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x11e1);
    ssl_send_alert(ssl_00,2,0x32);
    return false;
  }
  group = EC_group_p256();
  pEVar5 = ECDSA_SIG_new();
  std::unique_ptr<ecdsa_sig_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ecdsa_sig_st,bssl::internal::Deleter> *)&x,(pointer)pEVar5);
  pBVar6 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_68,(pointer)pBVar6);
  pBVar6 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_80,(pointer)pBVar6);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&x);
  if (((!bVar1) || (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_68), !bVar1)
      ) || (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_80), !bVar1)) {
    hs_local._7_1_ = false;
    goto LAB_00339e3f;
  }
  s = CBS_data((CBS *)&p256);
  pBVar6 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_68);
  pBVar6 = BN_bin2bn(s,0x20,pBVar6);
  if (pBVar6 != (BIGNUM *)0x0) {
    pBVar6 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_80);
    pBVar6 = BN_bin2bn(s + 0x20,0x20,pBVar6);
    if (pBVar6 != (BIGNUM *)0x0) {
      peVar7 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&x);
      pBVar6 = BN_bin2bn(s + 0x40,0x20,(BIGNUM *)peVar7->r);
      if (pBVar6 != (BIGNUM *)0x0) {
        peVar7 = std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&x);
        pBVar6 = BN_bin2bn(s + 0x60,0x20,(BIGNUM *)peVar7->s);
        if (pBVar6 != (BIGNUM *)0x0) {
          peVar8 = (pointer)EC_KEY_new();
          std::unique_ptr<ec_key_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&point,peVar8);
          peVar9 = (pointer)EC_POINT_new((EC_GROUP *)group);
          std::unique_ptr<ec_point_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ec_point_st,bssl::internal::Deleter> *)&local_a0,peVar9);
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&point);
          if ((bVar1) &&
             (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_a0), bVar1)) {
            peVar9 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get(&local_a0);
            pBVar6 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_68);
            y_00 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_80);
            iVar2 = EC_POINT_set_affine_coordinates_GFp
                              ((EC_GROUP *)group,(EC_POINT *)peVar9,pBVar6,y_00,(BN_CTX *)0x0);
            if (iVar2 == 0) goto LAB_00339c80;
            peVar8 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&point);
            iVar2 = EC_KEY_set_group((EC_KEY *)peVar8,(EC_GROUP *)group);
            if (iVar2 == 0) goto LAB_00339c80;
            peVar8 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&point);
            peVar9 = std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::get(&local_a0);
            iVar2 = EC_KEY_set_public_key((EC_KEY *)peVar8,(EC_POINT *)peVar9);
            if (iVar2 == 0) goto LAB_00339c80;
            bVar1 = tls1_channel_id_hash(hs,(uint8_t *)&digest_len,(size_t *)&iStack_f0);
            if (bVar1) {
              pEVar5 = (ECDSA_SIG *)
                       std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&x);
              peVar8 = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&point);
              iVar2 = ECDSA_do_verify((uchar *)&digest_len,iStack_f0,pEVar5,(EC_KEY *)peVar8);
              iVar3 = CRYPTO_fuzzer_mode_enabled();
              if (iVar3 != 0) {
                ERR_clear_error();
              }
              local_f1 = iVar3 != 0 || iVar2 != 0;
              if (local_f1) {
                ::OPENSSL_memcpy(ssl_00->s3->channel_id,s,0x40);
                *(ushort *)&ssl_00->s3->field_0xdc =
                     *(ushort *)&ssl_00->s3->field_0xdc & 0xff7f | 0x80;
                hs_local._7_1_ = true;
              }
              else {
                ERR_put_error(0x10,0,0x81,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                              ,0x120b);
                ssl_send_alert(ssl_00,2,0x33);
                hs_local._7_1_ = false;
              }
            }
            else {
              hs_local._7_1_ = false;
            }
          }
          else {
LAB_00339c80:
            hs_local._7_1_ = false;
          }
          std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&local_a0);
          std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&point);
          goto LAB_00339e3f;
        }
      }
    }
  }
  hs_local._7_1_ = false;
LAB_00339e3f:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_80);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_68);
  std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&x);
  return hs_local._7_1_;
}

Assistant:

bool tls1_verify_channel_id(SSL_HANDSHAKE *hs, const SSLMessage &msg) {
  SSL *const ssl = hs->ssl;
  // A Channel ID handshake message is structured to contain multiple
  // extensions, but the only one that can be present is Channel ID.
  uint16_t extension_type;
  CBS channel_id = msg.body, extension;
  if (!CBS_get_u16(&channel_id, &extension_type) ||             //
      !CBS_get_u16_length_prefixed(&channel_id, &extension) ||  //
      CBS_len(&channel_id) != 0 ||                              //
      extension_type != TLSEXT_TYPE_channel_id ||               //
      CBS_len(&extension) != TLSEXT_CHANNEL_ID_SIZE) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
    return false;
  }

  const EC_GROUP *p256 = EC_group_p256();
  UniquePtr<ECDSA_SIG> sig(ECDSA_SIG_new());
  UniquePtr<BIGNUM> x(BN_new()), y(BN_new());
  if (!sig || !x || !y) {
    return false;
  }

  const uint8_t *p = CBS_data(&extension);
  if (BN_bin2bn(p + 0, 32, x.get()) == NULL ||
      BN_bin2bn(p + 32, 32, y.get()) == NULL ||
      BN_bin2bn(p + 64, 32, sig->r) == NULL ||
      BN_bin2bn(p + 96, 32, sig->s) == NULL) {
    return false;
  }

  UniquePtr<EC_KEY> key(EC_KEY_new());
  UniquePtr<EC_POINT> point(EC_POINT_new(p256));
  if (!key || !point ||
      !EC_POINT_set_affine_coordinates_GFp(p256, point.get(), x.get(), y.get(),
                                           nullptr) ||
      !EC_KEY_set_group(key.get(), p256) ||
      !EC_KEY_set_public_key(key.get(), point.get())) {
    return false;
  }

  uint8_t digest[EVP_MAX_MD_SIZE];
  size_t digest_len;
  if (!tls1_channel_id_hash(hs, digest, &digest_len)) {
    return false;
  }

  bool sig_ok = ECDSA_do_verify(digest, digest_len, sig.get(), key.get());
  if (CRYPTO_fuzzer_mode_enabled()) {
    sig_ok = true;
    ERR_clear_error();
  }
  if (!sig_ok) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CHANNEL_ID_SIGNATURE_INVALID);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECRYPT_ERROR);
    return false;
  }

  OPENSSL_memcpy(ssl->s3->channel_id, p, 64);
  ssl->s3->channel_id_valid = true;
  return true;
}